

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

bool __thiscall
xatlas::internal::BitImage::canBlit
          (BitImage *this,BitImage *image,uint32_t offsetX,uint32_t offsetY)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar4 = 0;
  do {
    uVar1 = image->m_height;
    if (uVar1 <= uVar4) {
LAB_001abc9c:
      return uVar1 <= uVar4;
    }
    if (offsetY + uVar4 < this->m_height) {
      uVar8 = 0;
      do {
        uVar7 = (uint)uVar8;
        uVar3 = offsetX + uVar7;
        if (this->m_width <= uVar3) break;
        uVar6 = uVar3 & 0x3f;
        puVar5 = Array<unsigned_long>::operator[]
                           (&this->m_data,this->m_rowStride * (offsetY + uVar4) + (uVar3 >> 6));
        uVar2 = *puVar5;
        uVar3 = uVar7 & 0x3f;
        puVar5 = Array<unsigned_long>::operator[]
                           (&image->m_data,image->m_rowStride * uVar4 + (int)(uVar8 >> 6));
        if ((*puVar5 >> (sbyte)uVar3 & uVar2 >> (sbyte)uVar6) != 0) goto LAB_001abc9c;
        if (uVar3 < uVar6) {
          uVar3 = uVar6;
        }
        uVar3 = (uVar7 - uVar3) + 0x40;
        uVar8 = (ulong)uVar3;
      } while (uVar3 < image->m_width);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool canBlit(const BitImage &image, uint32_t offsetX, uint32_t offsetY) const
	{
		for (uint32_t y = 0; y < image.m_height; y++) {
			const uint32_t thisY = y + offsetY;
			if (thisY >= m_height)
				continue;
			uint32_t x = 0;
			for (;;) {
				const uint32_t thisX = x + offsetX;
				if (thisX >= m_width)
					break;
				const uint32_t thisBlockShift = thisX % 64;
				const uint64_t thisBlock = m_data[(thisX >> 6) + thisY * m_rowStride] >> thisBlockShift;
				const uint32_t blockShift = x % 64;
				const uint64_t block = image.m_data[(x >> 6) + y * image.m_rowStride] >> blockShift;
				if ((thisBlock & block) != 0)
					return false;
				x += 64 - max(thisBlockShift, blockShift);
				if (x >= image.m_width)
					break;
			}
		}
		return true;
	}